

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  ZSTD_dStage ZVar1;
  char *pcVar2;
  ZSTD_dStreamStage ZVar3;
  size_t err_code;
  size_t sVar4;
  size_t dstCapacity;
  
  ZVar1 = zds->stage;
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar4 = zds->outStart;
      dstCapacity = 0;
    }
    else {
      sVar4 = zds->outStart;
      dstCapacity = zds->outBuffSize - sVar4;
    }
    sVar4 = ZSTD_decompressContinue(zds,zds->outBuff + sVar4,dstCapacity,src,srcSize);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    if ((ZVar1 == ZSTDds_skipFrame) || (sVar4 != 0)) {
      zds->outEnd = zds->outStart + sVar4;
      ZVar3 = zdss_flush;
    }
    else {
      ZVar3 = zdss_read;
    }
    zds->streamStage = ZVar3;
  }
  else {
    sVar4 = 0;
    if (ZVar1 != ZSTDds_skipFrame) {
      sVar4 = (long)oend - (long)*op;
    }
    sVar4 = ZSTD_decompressContinue(zds,*op,sVar4,src,srcSize);
    if (0xffffffffffffff88 < sVar4) {
      return sVar4;
    }
    pcVar2 = *op;
    *op = pcVar2 + sVar4;
    zds->streamStage = zdss_read;
    if (oend < pcVar2 + sVar4) {
      __assert_fail("*op <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa338,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
    if (zds->outBufferMode != ZSTD_bm_stable) {
      __assert_fail("zds->outBufferMode == ZSTD_bm_stable",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa339,
                    "size_t ZSTD_decompressContinueStream(ZSTD_DStream *, char **, char *, const void *, size_t)"
                   );
    }
  }
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}